

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::
GenerateConstexprAggregateInitializer(SingularString *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar2 = "\n      /*decltype($field_$)*/ {nullptr, false},\n    ";
    uVar1 = 0x34;
  }
  else {
    pcVar2 = 
    "\n      /*decltype($field_$)*/ {\n          &::_pbi::fixed_address_empty_string,\n          ::_pbi::ConstantInitialized{},\n      },\n    "
    ;
    uVar1 = 0x85;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void SingularString::GenerateConstexprAggregateInitializer(
    io::Printer* p) const {
  if (is_inlined()) {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {nullptr, false},
    )cc");
  } else {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {
          &::_pbi::fixed_address_empty_string,
          ::_pbi::ConstantInitialized{},
      },
    )cc");
  }
}